

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_check_date(lysp_ctx *ctx,char *date,size_t date_len,char *stmt)

{
  ushort **ppuVar1;
  char *pcVar2;
  ly_ctx *plVar3;
  uint8_t i;
  long lVar4;
  tm tm;
  tm tm_;
  
  if (date == (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar3 = (ly_ctx *)0x0;
    }
    else {
      plVar3 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar3,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","date","lysp_check_date");
  }
  else if (date_len == 10) {
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      if (((char)lVar4 == '\a') || (((uint)lVar4 & 0xff) == 4)) {
        if (date[lVar4] != '-') goto LAB_0015b625;
      }
      else {
        ppuVar1 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar1 + (long)date[lVar4] * 2 + 1) & 8) == 0) goto LAB_0015b625;
      }
    }
    tm.tm_isdst = 0;
    tm._36_4_ = 0;
    tm.tm_gmtoff = 0;
    tm.tm_mon = 0;
    tm.tm_year = 0;
    tm.tm_wday = 0;
    tm.tm_yday = 0;
    tm.tm_sec = 0;
    tm.tm_min = 0;
    tm.tm_hour = 0;
    tm.tm_mday = 0;
    tm.tm_zone = (char *)0x0;
    pcVar2 = strptime(date,"%Y-%m-%d",(tm *)&tm);
    if (pcVar2 == date + 10 && pcVar2 != (char *)0x0) {
      tm_.tm_gmtoff = tm.tm_gmtoff;
      tm_.tm_zone = tm.tm_zone;
      tm_.tm_mon = tm.tm_mon;
      tm_.tm_year = tm.tm_year;
      tm_.tm_wday = tm.tm_wday;
      tm_.tm_yday = tm.tm_yday;
      tm_.tm_sec = tm.tm_sec;
      tm_.tm_min = tm.tm_min;
      tm_.tm_hour = tm.tm_hour;
      tm_.tm_mday = tm.tm_mday;
      tm_._36_4_ = tm._36_4_;
      tm_.tm_isdst = -1;
      mktime((tm *)&tm_);
      if (tm.tm_mday == tm_.tm_mday) {
        return LY_SUCCESS;
      }
    }
LAB_0015b625:
    if (stmt != (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar3 = (ly_ctx *)0x0;
      }
      else {
        plVar3 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_vlog(plVar3,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",10,date,stmt);
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar3 = (ly_ctx *)0x0;
    }
    else {
      plVar3 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar3,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid length %u of a date.",date_len);
  }
  return LY_EINVAL;
}

Assistant:

LY_ERR
lysp_check_date(struct lysp_ctx *ctx, const char *date, size_t date_len, const char *stmt)
{
    struct tm tm, tm_;
    char *r;

    LY_CHECK_ARG_RET(PARSER_CTX(ctx), date, LY_EINVAL);

    if (date_len != LY_REV_SIZE - 1) {
        LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG, "Invalid length %" PRIu32 " of a date.", (uint32_t)date_len);
        return LY_EINVAL;
    }

    /* check format: YYYY-MM-DD */
    for (uint8_t i = 0; i < date_len; i++) {
        if ((i == 4) || (i == 7)) {
            if (date[i] != '-') {
                goto error;
            }
        } else if (!isdigit(date[i])) {
            goto error;
        }
    }

    /* check content, e.g. 2018-02-31 */
    memset(&tm, 0, sizeof tm);
    r = strptime(date, "%Y-%m-%d", &tm);
    if (!r || (r != &date[LY_REV_SIZE - 1])) {
        goto error;
    }
    memcpy(&tm_, &tm, sizeof tm);

    /* Disabling DST: Set tm_isdst to -1 so that mktime() won't adjust for daylight saving time. */
    tm_.tm_isdst = -1;

    mktime(&tm_); /* mktime modifies tm_ if it refers invalid date */
    if (tm.tm_mday != tm_.tm_mday) { /* e.g 2018-02-29 -> 2018-03-01 */
        /* checking days is enough, since other errors
         * have been checked by strptime() */
        goto error;
    }

    return LY_SUCCESS;

error:
    if (stmt) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)date_len, date, stmt);
    }
    return LY_EINVAL;
}